

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtextures.c
# Opt level: O2

Image * GenImageGradientRadial
                  (Image *__return_storage_ptr__,int width,int height,float density,Color inner,
                  Color outer)

{
  char cVar1;
  short sVar5;
  short sVar6;
  short sVar7;
  undefined1 auVar8 [14];
  undefined1 auVar9 [14];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  unkuint9 Var12;
  undefined1 auVar13 [11];
  undefined1 auVar14 [13];
  undefined1 auVar15 [14];
  undefined1 auVar16 [11];
  undefined1 auVar17 [13];
  undefined1 auVar18 [14];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  uint6 uVar23;
  uint6 uVar24;
  void *pvVar25;
  int iVar26;
  ulong uVar27;
  void *pvVar28;
  ulong uVar29;
  ulong uVar30;
  int x;
  ulong uVar31;
  short sVar32;
  float fVar33;
  undefined1 auVar36 [16];
  ushort uVar37;
  ushort uVar38;
  float fVar39;
  char cVar2;
  char cVar3;
  char cVar4;
  undefined4 uVar34;
  undefined6 uVar35;
  
  pvVar25 = malloc((long)(height * width) << 2);
  iVar26 = height;
  if (width < height) {
    iVar26 = width;
  }
  Var12 = CONCAT81(SUB158(ZEXT815(0),7),outer.a);
  auVar19._9_6_ = 0;
  auVar19._0_9_ = Var12;
  auVar13._1_10_ = SUB1510(auVar19 << 0x30,5);
  auVar13[0] = outer.b;
  auVar20._11_4_ = 0;
  auVar20._0_11_ = auVar13;
  auVar14._1_12_ = SUB1512(auVar20 << 0x20,3);
  auVar14[0] = outer.g;
  uVar37 = CONCAT11(0,outer.r);
  auVar10._2_13_ = auVar14;
  auVar10._0_2_ = uVar37;
  auVar8._10_2_ = 0;
  auVar8._0_10_ = auVar10._0_10_;
  auVar8._12_2_ = (short)Var12;
  uVar23 = CONCAT42(auVar8._10_4_,auVar13._0_2_);
  auVar15._6_8_ = 0;
  auVar15._0_6_ = uVar23;
  Var12 = CONCAT81(SUB158(ZEXT815(0),7),inner.a);
  auVar21._9_6_ = 0;
  auVar21._0_9_ = Var12;
  auVar16._1_10_ = SUB1510(auVar21 << 0x30,5);
  auVar16[0] = inner.b;
  auVar22._11_4_ = 0;
  auVar22._0_11_ = auVar16;
  auVar17._1_12_ = SUB1512(auVar22 << 0x20,3);
  auVar17[0] = inner.g;
  uVar38 = CONCAT11(0,inner.r);
  auVar11._2_13_ = auVar17;
  auVar11._0_2_ = uVar38;
  auVar9._10_2_ = 0;
  auVar9._0_10_ = auVar11._0_10_;
  auVar9._12_2_ = (short)Var12;
  uVar24 = CONCAT42(auVar9._10_4_,auVar16._0_2_);
  auVar18._6_8_ = 0;
  auVar18._0_6_ = uVar24;
  uVar29 = 0;
  uVar30 = 0;
  if (0 < width) {
    uVar30 = (ulong)(uint)width;
  }
  uVar27 = 0;
  if (0 < height) {
    uVar27 = (ulong)(uint)height;
  }
  pvVar28 = pvVar25;
  for (; uVar29 != uVar27; uVar29 = uVar29 + 1) {
    for (uVar31 = 0; uVar30 != uVar31; uVar31 = uVar31 + 1) {
      fVar33 = hypotf((float)(int)uVar31 - (float)width * 0.5,
                      (float)(int)uVar29 - (float)height * 0.5);
      fVar33 = (fVar33 - (float)iVar26 * 0.5 * density) / ((1.0 - density) * (float)iVar26 * 0.5);
      if (fVar33 <= 0.0) {
        fVar33 = 0.0;
      }
      if (1.0 <= fVar33) {
        fVar33 = 1.0;
      }
      fVar39 = 1.0 - fVar33;
      auVar36._0_4_ = (int)(fVar39 * (float)uVar38 + fVar33 * (float)uVar37);
      auVar36._4_4_ =
           (int)(fVar39 * (float)(int)CONCAT82(SUB148(auVar18 << 0x40,6),auVar17._0_2_) +
                fVar33 * (float)(int)CONCAT82(SUB148(auVar15 << 0x40,6),auVar14._0_2_));
      auVar36._8_4_ = (int)(fVar39 * (float)(int)uVar24 + fVar33 * (float)(int)uVar23);
      auVar36._12_4_ =
           (int)(fVar39 * (float)(auVar9._10_4_ >> 0x10) + fVar33 * (float)(auVar8._10_4_ >> 0x10));
      auVar36 = auVar36 & _DAT_00174250;
      sVar5 = auVar36._0_2_;
      cVar1 = (0 < sVar5) * (sVar5 < 0x100) * auVar36[0] - (0xff < sVar5);
      sVar5 = auVar36._2_2_;
      sVar32 = CONCAT11((0 < sVar5) * (sVar5 < 0x100) * auVar36[2] - (0xff < sVar5),cVar1);
      sVar5 = auVar36._4_2_;
      cVar2 = (0 < sVar5) * (sVar5 < 0x100) * auVar36[4] - (0xff < sVar5);
      sVar5 = auVar36._6_2_;
      uVar34 = CONCAT13((0 < sVar5) * (sVar5 < 0x100) * auVar36[6] - (0xff < sVar5),
                        CONCAT12(cVar2,sVar32));
      sVar5 = auVar36._8_2_;
      cVar3 = (0 < sVar5) * (sVar5 < 0x100) * auVar36[8] - (0xff < sVar5);
      sVar5 = auVar36._10_2_;
      uVar35 = CONCAT15((0 < sVar5) * (sVar5 < 0x100) * auVar36[10] - (0xff < sVar5),
                        CONCAT14(cVar3,uVar34));
      sVar5 = auVar36._12_2_;
      cVar4 = (0 < sVar5) * (sVar5 < 0x100) * auVar36[0xc] - (0xff < sVar5);
      sVar7 = auVar36._14_2_;
      sVar5 = (short)((uint)uVar34 >> 0x10);
      sVar6 = (short)((uint6)uVar35 >> 0x20);
      sVar7 = (short)(CONCAT17((0 < sVar7) * (sVar7 < 0x100) * auVar36[0xe] - (0xff < sVar7),
                               CONCAT16(cVar4,uVar35)) >> 0x30);
      *(uint *)((long)pvVar28 + uVar31 * 4) =
           CONCAT13((0 < sVar7) * (sVar7 < 0x100) * cVar4 - (0xff < sVar7),
                    CONCAT12((0 < sVar6) * (sVar6 < 0x100) * cVar3 - (0xff < sVar6),
                             CONCAT11((0 < sVar5) * (sVar5 < 0x100) * cVar2 - (0xff < sVar5),
                                      (0 < sVar32) * (sVar32 < 0x100) * cVar1 - (0xff < sVar32))));
    }
    pvVar28 = (void *)((long)pvVar28 + (long)width * 4);
  }
  __return_storage_ptr__->data = pvVar25;
  __return_storage_ptr__->width = width;
  __return_storage_ptr__->height = height;
  __return_storage_ptr__->mipmaps = 1;
  __return_storage_ptr__->format = 7;
  return __return_storage_ptr__;
}

Assistant:

Image GenImageGradientRadial(int width, int height, float density, Color inner, Color outer)
{
    Color *pixels = (Color *)RL_MALLOC(width*height*sizeof(Color));
    float radius = (width < height)? (float)width/2.0f : (float)height/2.0f;

    float centerX = (float)width/2.0f;
    float centerY = (float)height/2.0f;

    for (int y = 0; y < height; y++)
    {
        for (int x = 0; x < width; x++)
        {
            float dist = hypotf((float)x - centerX, (float)y - centerY);
            float factor = (dist - radius*density)/(radius*(1.0f - density));

            factor = (float)fmax(factor, 0.0f);
            factor = (float)fmin(factor, 1.f); // dist can be bigger than radius, so we have to check

            pixels[y*width + x].r = (int)((float)outer.r*factor + (float)inner.r*(1.0f - factor));
            pixels[y*width + x].g = (int)((float)outer.g*factor + (float)inner.g*(1.0f - factor));
            pixels[y*width + x].b = (int)((float)outer.b*factor + (float)inner.b*(1.0f - factor));
            pixels[y*width + x].a = (int)((float)outer.a*factor + (float)inner.a*(1.0f - factor));
        }
    }

    Image image = {
        .data = pixels,
        .width = width,
        .height = height,
        .format = PIXELFORMAT_UNCOMPRESSED_R8G8B8A8,
        .mipmaps = 1
    };

    return image;
}